

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O1

void __thiscall QTextHtmlParser::parseCloseTag(QTextHtmlParser *this)

{
  int iVar1;
  char16_t *pcVar2;
  QTextHtmlParserNode *pQVar3;
  undefined1 *puVar4;
  QTextHtmlParserNode **ppQVar5;
  long lVar6;
  qsizetype qVar7;
  char cVar8;
  pointer ppQVar9;
  iterator iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  long in_FS_OFFSET;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QString local_88;
  QString local_70;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->pos = this->pos + 1;
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  parseWord(&local_88,this);
  QString::toLower_helper(&local_70);
  QString::trimmed_helper(&local_58);
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  iVar1 = this->pos;
  iVar13 = this->len;
  if (this->len < iVar1) {
    iVar13 = iVar1;
  }
  pcVar2 = (this->txt).d.ptr;
  lVar12 = 0;
  do {
    if ((long)iVar13 - (long)iVar1 == lVar12) break;
    this->pos = iVar1 + 1 + (int)lVar12;
    lVar6 = iVar1 + lVar12;
    lVar12 = lVar12 + 1;
  } while (pcVar2[lVar6] != L'>');
  iVar13 = (int)(this->nodes).d.size;
  iVar1 = iVar13 + -1;
  iVar11 = iVar1;
  if (0 < iVar1) {
    iVar13 = iVar13 + -2;
    pQVar3 = (this->nodes).d.ptr[iVar13];
    puVar4 = (undefined1 *)(pQVar3->tag).d.size;
    if (((puVar4 == (undefined1 *)local_58.d.size) &&
        (QVar14.m_data = (pQVar3->tag).d.ptr, QVar14.m_size = (qsizetype)puVar4,
        QVar16.m_data = local_58.d.ptr, QVar16.m_size = local_58.d.size,
        cVar8 = QtPrivate::equalStrings(QVar14,QVar16), cVar8 != '\0')) &&
       ((0x38 < (ulong)(uint)pQVar3->id ||
        (iVar11 = iVar13, (0x1000000e0000000U >> ((ulong)(uint)pQVar3->id & 0x3f) & 1) == 0)))) {
      iVar11 = iVar1;
    }
  }
  qVar7 = local_58.d.size;
  pcVar2 = local_58.d.ptr;
  if (iVar11 != 0) {
    ppQVar5 = (this->nodes).d.ptr;
    do {
      pQVar3 = ppQVar5[iVar11];
      puVar4 = (undefined1 *)(pQVar3->tag).d.size;
      if ((puVar4 == (undefined1 *)qVar7) &&
         (QVar15.m_data = (pQVar3->tag).d.ptr, QVar15.m_size = (qsizetype)puVar4,
         QVar17.m_data = pcVar2, QVar17.m_size = qVar7,
         cVar8 = QtPrivate::equalStrings(QVar15,QVar17), cVar8 != '\0')) {
        if (((uint)pQVar3->wsm < 5) &&
           ((((0x1aU >> (pQVar3->wsm & 0x1f) & 1) != 0 && ((pQVar3->field_0x91 & 0xe) == 0)) &&
            (cVar8 = QString::endsWith((QChar)((short)ppQVar5[iVar1] + L'\x18'),10), cVar8 != '\0'))
           )) {
          lVar12 = (this->nodes).d.size;
          ppQVar9 = QList<QTextHtmlParserNode_*>::data(&this->nodes);
          QString::chop(*(long *)((long)ppQVar9 + ((lVar12 << 0x20) + -0x100000000 >> 0x1d)) + 0x18)
          ;
        }
        newNode(this,(this->nodes).d.ptr[iVar11]->parent);
        iVar10 = QList<QTextHtmlParserNode_*>::end(&this->nodes);
        QTextHtmlParserNode::initializeProperties
                  (iVar10.i[-1],(this->nodes).d.ptr[iVar10.i[-1]->parent],this);
        break;
      }
      iVar11 = pQVar3->parent;
    } while (iVar11 != 0);
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextHtmlParser::parseCloseTag()
{
    ++pos;
    QString tag = parseWord().toLower().trimmed();
    while (pos < len) {
        QChar c = txt.at(pos++);
        if (c == u'>')
            break;
    }

    // find corresponding open node
    int p = last();
    if (p > 0
        && at(p - 1).tag == tag
        && at(p - 1).mayNotHaveChildren())
        p--;

    while (p && at(p).tag != tag)
        p = at(p).parent;

    // simply ignore the tag if we can't find
    // a corresponding open node, for broken
    // html such as <font>blah</font></font>
    if (!p)
        return;

    // in a white-space preserving environment strip off a trailing newline
    // since the closing of the opening block element will automatically result
    // in a new block for elements following the <pre>
    // ...foo\n</pre><p>blah -> foo</pre><p>blah
    if ((at(p).wsm == QTextHtmlParserNode::WhiteSpacePre
         || at(p).wsm == QTextHtmlParserNode::WhiteSpacePreWrap
         || at(p).wsm == QTextHtmlParserNode::WhiteSpacePreLine)
        && at(p).isBlock()) {
        if (at(last()).text.endsWith(u'\n'))
            nodes[last()]->text.chop(1);
    }

    newNode(at(p).parent);
    resolveNode();
}